

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O2

void __thiscall leveldb::_Test_ApproximateSizes::_Run(_Test_ApproximateSizes *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint64_t uVar4;
  leveldb *this_00;
  uint64_t uVar5;
  DBTest *in_RCX;
  int i;
  int i_00;
  int i_01;
  int i_02;
  int i_03;
  int i_04;
  int i_05;
  int i_06;
  int i_07;
  int i_08;
  int i_09;
  uint uVar6;
  uint64_t low;
  ulong uVar7;
  Slice cstart;
  string cend_str;
  Slice cend;
  Random rnd;
  Slice local_240;
  Options options;
  string cstart_str;
  
  do {
    DBTest::CurrentOptions(&options,&this->super_DBTest);
    options.write_buffer_size = 100000000;
    options.compression = kNoCompression;
    DBTest::DestroyAndReopen(&this->super_DBTest,(Options *)0x0);
    test::Tester::Tester
              ((Tester *)&cstart_str,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x49a);
    cend_str._M_dataplus._M_p = "";
    cend_str._M_string_length = 0;
    cstart.data_ = "xyz";
    cstart.size_ = 3;
    uVar4 = DBTest::Size(&this->super_DBTest,(Slice *)&cend_str,&cstart);
    bVar1 = Between(uVar4,0,0);
    test::Tester::Is((Tester *)&cstart_str,bVar1,"Between(Size(\"\", \"xyz\"), 0, 0)");
    test::Tester::~Tester((Tester *)&cstart_str);
    DBTest::Reopen(&this->super_DBTest,&options);
    test::Tester::Tester
              ((Tester *)&cstart_str,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x49c);
    cend_str._M_dataplus._M_p = "";
    cend_str._M_string_length = 0;
    cstart.data_ = "xyz";
    cstart.size_ = 3;
    uVar4 = DBTest::Size(&this->super_DBTest,(Slice *)&cend_str,&cstart);
    bVar1 = Between(uVar4,0,0);
    test::Tester::Is((Tester *)&cstart_str,bVar1,"Between(Size(\"\", \"xyz\"), 0, 0)");
    test::Tester::~Tester((Tester *)&cstart_str);
    test::Tester::Tester
              ((Tester *)&cstart_str,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x49f);
    iVar2 = DBTest::NumTableFilesAtLevel(&this->super_DBTest,0);
    cend_str._M_dataplus._M_p._0_4_ = iVar2;
    cstart.data_ = (char *)((ulong)cstart.data_ & 0xffffffff00000000);
    test::Tester::IsEq<int,int>((Tester *)&cstart_str,(int *)&cend_str,(int *)&cstart);
    test::Tester::~Tester((Tester *)&cstart_str);
    rnd.seed_ = 0x12d;
    for (uVar6 = 0; iVar2 = (int)in_RCX, uVar6 != 0x50; uVar6 = uVar6 + 1) {
      test::Tester::Tester
                ((Tester *)&cstart_str,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
                 ,0x4a5);
      Key_abi_cxx11_(&cend_str,(leveldb *)(ulong)uVar6,i);
      RandomString_abi_cxx11_((string *)&cstart,(leveldb *)&rnd,(Random *)0x186a0,iVar2);
      in_RCX = (DBTest *)&cstart;
      DBTest::Put((DBTest *)&cend,(string *)this,&cend_str);
      test::Tester::IsOk((Tester *)&cstart_str,(Status *)&cend);
      Status::~Status((Status *)&cend);
      std::__cxx11::string::~string((string *)&cstart);
      std::__cxx11::string::~string((string *)&cend_str);
      test::Tester::~Tester((Tester *)&cstart_str);
    }
    test::Tester::Tester
              ((Tester *)&cstart_str,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x4a9);
    cstart.data_ = "";
    cstart.size_ = 0;
    Key_abi_cxx11_(&cend_str,(leveldb *)0x32,i_00);
    cend.data_ = cend_str._M_dataplus._M_p;
    cend.size_ = cend_str._M_string_length;
    uVar4 = DBTest::Size(&this->super_DBTest,&cstart,&cend);
    bVar1 = Between(uVar4,0,0);
    test::Tester::Is((Tester *)&cstart_str,bVar1,"Between(Size(\"\", Key(50)), 0, 0)");
    std::__cxx11::string::~string((string *)&cend_str);
    test::Tester::~Tester((Tester *)&cstart_str);
    if (options.reuse_logs == false) {
      for (iVar2 = 0; iVar2 != 3; iVar2 = iVar2 + 1) {
        DBTest::Reopen(&this->super_DBTest,&options);
        this_00 = (leveldb *)0x0;
        while( true ) {
          uVar6 = (uint)this_00;
          if (0x4f < uVar6) break;
          low = 100000;
          uVar4 = 0x19a28;
          for (uVar7 = 0; uVar7 < 0x50; uVar7 = uVar7 + 10) {
            test::Tester::Tester
                      ((Tester *)&cstart_str,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
                       ,0x4b9);
            cstart.data_ = "";
            cstart.size_ = 0;
            Key_abi_cxx11_(&cend_str,(leveldb *)(uVar7 & 0xffffffff),i_02);
            cend.data_ = cend_str._M_dataplus._M_p;
            cend.size_ = cend_str._M_string_length;
            uVar5 = DBTest::Size(&this->super_DBTest,&cstart,&cend);
            bVar1 = Between(uVar5,low - 100000,uVar4 - 0x19a28);
            test::Tester::Is((Tester *)&cstart_str,bVar1,
                             "Between(Size(\"\", Key(i)), S1 * i, S2 * i)");
            std::__cxx11::string::~string((string *)&cend_str);
            test::Tester::~Tester((Tester *)&cstart_str);
            test::Tester::Tester
                      ((Tester *)&cstart_str,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
                       ,0x4bb);
            cend.data_ = "";
            cend.size_ = 0;
            Key_abi_cxx11_((string *)&cstart,(leveldb *)(uVar7 & 0xffffffff),i_03);
            std::operator+(&cend_str,(string *)&cstart,".suffix");
            local_240.data_ = cend_str._M_dataplus._M_p;
            local_240.size_ = cend_str._M_string_length;
            uVar5 = DBTest::Size(&this->super_DBTest,&cend,&local_240);
            bVar1 = Between(uVar5,low,uVar4);
            test::Tester::Is((Tester *)&cstart_str,bVar1,
                             "Between(Size(\"\", Key(i) + \".suffix\"), S1 * (i + 1), S2 * (i + 1))"
                            );
            std::__cxx11::string::~string((string *)&cend_str);
            std::__cxx11::string::~string((string *)&cstart);
            test::Tester::~Tester((Tester *)&cstart_str);
            test::Tester::Tester
                      ((Tester *)&cstart_str,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
                       ,0x4bc);
            Key_abi_cxx11_(&cend_str,(leveldb *)(uVar7 & 0xffffffff),i_04);
            cend.data_ = cend_str._M_dataplus._M_p;
            cend.size_ = cend_str._M_string_length;
            Key_abi_cxx11_((string *)&cstart,(leveldb *)(ulong)((int)uVar7 + 10),i_05);
            local_240.data_ = cstart.data_;
            local_240.size_ = cstart.size_;
            uVar5 = DBTest::Size(&this->super_DBTest,&cend,&local_240);
            bVar1 = Between(uVar5,1000000,0x100590);
            test::Tester::Is((Tester *)&cstart_str,bVar1,
                             "Between(Size(Key(i), Key(i + 10)), S1 * 10, S2 * 10)");
            std::__cxx11::string::~string((string *)&cstart);
            std::__cxx11::string::~string((string *)&cend_str);
            test::Tester::~Tester((Tester *)&cstart_str);
            low = low + 1000000;
            uVar4 = uVar4 + 0x100590;
          }
          test::Tester::Tester
                    ((Tester *)&cstart_str,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
                     ,0x4be);
          cstart.data_ = "";
          cstart.size_ = 0;
          Key_abi_cxx11_(&cend_str,(leveldb *)0x32,i_06);
          cend.data_ = cend_str._M_dataplus._M_p;
          cend.size_ = cend_str._M_string_length;
          uVar4 = DBTest::Size(&this->super_DBTest,&cstart,&cend);
          bVar1 = Between(uVar4,5000000,0x501bd0);
          test::Tester::Is((Tester *)&cstart_str,bVar1,
                           "Between(Size(\"\", Key(50)), S1 * 50, S2 * 50)");
          std::__cxx11::string::~string((string *)&cend_str);
          test::Tester::~Tester((Tester *)&cstart_str);
          test::Tester::Tester
                    ((Tester *)&cstart_str,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
                     ,0x4bf);
          cend.data_ = "";
          cend.size_ = 0;
          Key_abi_cxx11_((string *)&cstart,(leveldb *)0x32,i_07);
          std::operator+(&cend_str,(string *)&cstart,".suffix");
          local_240.data_ = cend_str._M_dataplus._M_p;
          local_240.size_ = cend_str._M_string_length;
          uVar4 = DBTest::Size(&this->super_DBTest,&cend,&local_240);
          bVar1 = Between(uVar4,5000000,0x501bd0);
          test::Tester::Is((Tester *)&cstart_str,bVar1,
                           "Between(Size(\"\", Key(50) + \".suffix\"), S1 * 50, S2 * 50)");
          std::__cxx11::string::~string((string *)&cend_str);
          std::__cxx11::string::~string((string *)&cstart);
          test::Tester::~Tester((Tester *)&cstart_str);
          Key_abi_cxx11_(&cstart_str,this_00,i_08);
          Key_abi_cxx11_(&cend_str,(leveldb *)(ulong)(uVar6 + 9),i_09);
          cstart.data_ = cstart_str._M_dataplus._M_p;
          cstart.size_ = cstart_str._M_string_length;
          cend.data_ = cend_str._M_dataplus._M_p;
          cend.size_ = cend_str._M_string_length;
          in_RCX = (DBTest *)&cend;
          DBImpl::TEST_CompactRange((DBImpl *)(this->super_DBTest).db_,0,&cstart,&cend);
          std::__cxx11::string::~string((string *)&cend_str);
          std::__cxx11::string::~string((string *)&cstart_str);
          this_00 = (leveldb *)(ulong)(uVar6 + 10);
        }
        test::Tester::Tester
                  ((Tester *)&cstart_str,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
                   ,0x4c8);
        iVar3 = DBTest::NumTableFilesAtLevel(&this->super_DBTest,0);
        cend_str._M_dataplus._M_p._0_4_ = iVar3;
        cstart.data_ = (char *)((ulong)cstart.data_ & 0xffffffff00000000);
        test::Tester::IsEq<int,int>((Tester *)&cstart_str,(int *)&cend_str,(int *)&cstart);
        test::Tester::~Tester((Tester *)&cstart_str);
        test::Tester::Tester
                  ((Tester *)&cstart_str,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
                   ,0x4c9);
        iVar3 = DBTest::NumTableFilesAtLevel(&this->super_DBTest,1);
        cend_str._M_dataplus._M_p._0_4_ = iVar3;
        cstart.data_ = (char *)((ulong)cstart.data_ & 0xffffffff00000000);
        test::Tester::IsGt<int,int>((Tester *)&cstart_str,(int *)&cend_str,(int *)&cstart);
        test::Tester::~Tester((Tester *)&cstart_str);
      }
    }
    else {
      DBTest::Reopen(&this->super_DBTest,&options);
      test::Tester::Tester
                ((Tester *)&cstart_str,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
                 ,0x4af);
      cstart.data_ = "";
      cstart.size_ = 0;
      Key_abi_cxx11_(&cend_str,(leveldb *)0x32,i_01);
      cend.data_ = cend_str._M_dataplus._M_p;
      cend.size_ = cend_str._M_string_length;
      uVar4 = DBTest::Size(&this->super_DBTest,&cstart,&cend);
      bVar1 = Between(uVar4,0,0);
      test::Tester::Is((Tester *)&cstart_str,bVar1,"Between(Size(\"\", Key(50)), 0, 0)");
      std::__cxx11::string::~string((string *)&cend_str);
      test::Tester::~Tester((Tester *)&cstart_str);
    }
    bVar1 = DBTest::ChangeOptions(&this->super_DBTest);
  } while (bVar1);
  return;
}

Assistant:

TEST(DBTest, ApproximateSizes) {
  do {
    Options options = CurrentOptions();
    options.write_buffer_size = 100000000;  // Large write buffer
    options.compression = kNoCompression;
    DestroyAndReopen();

    ASSERT_TRUE(Between(Size("", "xyz"), 0, 0));
    Reopen(&options);
    ASSERT_TRUE(Between(Size("", "xyz"), 0, 0));

    // Write 8MB (80 values, each 100K)
    ASSERT_EQ(NumTableFilesAtLevel(0), 0);
    const int N = 80;
    static const int S1 = 100000;
    static const int S2 = 105000;  // Allow some expansion from metadata
    Random rnd(301);
    for (int i = 0; i < N; i++) {
      ASSERT_OK(Put(Key(i), RandomString(&rnd, S1)));
    }

    // 0 because GetApproximateSizes() does not account for memtable space
    ASSERT_TRUE(Between(Size("", Key(50)), 0, 0));

    if (options.reuse_logs) {
      // Recovery will reuse memtable, and GetApproximateSizes() does not
      // account for memtable usage;
      Reopen(&options);
      ASSERT_TRUE(Between(Size("", Key(50)), 0, 0));
      continue;
    }

    // Check sizes across recovery by reopening a few times
    for (int run = 0; run < 3; run++) {
      Reopen(&options);

      for (int compact_start = 0; compact_start < N; compact_start += 10) {
        for (int i = 0; i < N; i += 10) {
          ASSERT_TRUE(Between(Size("", Key(i)), S1 * i, S2 * i));
          ASSERT_TRUE(Between(Size("", Key(i) + ".suffix"), S1 * (i + 1),
                              S2 * (i + 1)));
          ASSERT_TRUE(Between(Size(Key(i), Key(i + 10)), S1 * 10, S2 * 10));
        }
        ASSERT_TRUE(Between(Size("", Key(50)), S1 * 50, S2 * 50));
        ASSERT_TRUE(Between(Size("", Key(50) + ".suffix"), S1 * 50, S2 * 50));

        std::string cstart_str = Key(compact_start);
        std::string cend_str = Key(compact_start + 9);
        Slice cstart = cstart_str;
        Slice cend = cend_str;
        dbfull()->TEST_CompactRange(0, &cstart, &cend);
      }

      ASSERT_EQ(NumTableFilesAtLevel(0), 0);
      ASSERT_GT(NumTableFilesAtLevel(1), 0);
    }
  } while (ChangeOptions());
}